

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver3.c
# Opt level: O0

int sat_solver3_lit_removable(sat_solver3 *s,int x,int minl)

{
  int start;
  int iVar1;
  int iVar2;
  lit l;
  clause *c_00;
  lit *plVar3;
  int local_3c;
  int v_1;
  int i;
  lit *lits;
  clause *c;
  int v;
  int top;
  int minl_local;
  int x_local;
  sat_solver3 *s_local;
  
  start = veci_size(&s->tagged);
  if (s->reasons[x] == 0) {
    __assert_fail("s->reasons[x] != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver3.c"
                  ,0x2e9,"int sat_solver3_lit_removable(sat_solver3 *, int, int)");
  }
  veci_resize(&s->stack,0);
  veci_push(&s->stack,x);
  while( true ) {
    iVar1 = veci_size(&s->stack);
    if (iVar1 == 0) {
      return 1;
    }
    iVar1 = veci_pop(&s->stack);
    if (s->reasons[iVar1] == 0) break;
    iVar2 = clause_is_lit(s->reasons[iVar1]);
    if (iVar2 == 0) {
      c_00 = clause_read(s,s->reasons[iVar1]);
      plVar3 = clause_begin(c_00);
      for (local_3c = 1; iVar1 = clause_size(c_00), local_3c < iVar1; local_3c = local_3c + 1) {
        iVar1 = lit_var(plVar3[local_3c]);
        iVar2 = var_tag(s,iVar1);
        if ((iVar2 == 0) && (iVar2 = var_level(s,iVar1), iVar2 != 0)) {
          if ((s->reasons[iVar1] == 0) ||
             (iVar2 = var_level(s,iVar1), (1 << ((byte)iVar2 & 0x1f) & minl) == 0)) {
            solver2_clear_tags(s,start);
            return 0;
          }
          iVar2 = lit_var(plVar3[local_3c]);
          veci_push(&s->stack,iVar2);
          var_set_tag(s,iVar1,1);
        }
      }
    }
    else {
      l = clause_read_lit(s->reasons[iVar1]);
      iVar1 = lit_var(l);
      iVar2 = var_tag(s,iVar1);
      if ((iVar2 == 0) && (iVar2 = var_level(s,iVar1), iVar2 != 0)) {
        if ((s->reasons[iVar1] == 0) ||
           (iVar2 = var_level(s,iVar1), (1 << ((byte)iVar2 & 0x1f) & minl) == 0)) {
          solver2_clear_tags(s,start);
          return 0;
        }
        veci_push(&s->stack,iVar1);
        var_set_tag(s,iVar1,1);
      }
    }
  }
  __assert_fail("s->reasons[v] != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver3.c"
                ,0x2ef,"int sat_solver3_lit_removable(sat_solver3 *, int, int)");
}

Assistant:

static int sat_solver3_lit_removable(sat_solver3* s, int x, int minl)
{
    int      top     = veci_size(&s->tagged);

    assert(s->reasons[x] != 0);
    veci_resize(&s->stack,0);
    veci_push(&s->stack,x);

    while (veci_size(&s->stack)){
        int v = veci_pop(&s->stack);
        assert(s->reasons[v] != 0);
        if (clause_is_lit(s->reasons[v])){
            v = lit_var(clause_read_lit(s->reasons[v]));
            if (!var_tag(s,v) && var_level(s, v)){
                if (s->reasons[v] != 0 && ((1 << (var_level(s, v) & 31)) & minl)){
                    veci_push(&s->stack,v);
                    var_set_tag(s, v, 1);
                }else{
                    solver2_clear_tags(s, top);
                    return 0;
                }
            }
        }else{
            clause* c = clause_read(s, s->reasons[v]);
            lit* lits = clause_begin(c);
            int  i;
            for (i = 1; i < clause_size(c); i++){
                int v = lit_var(lits[i]);
                if (!var_tag(s,v) && var_level(s, v)){
                    if (s->reasons[v] != 0 && ((1 << (var_level(s, v) & 31)) & minl)){
                        veci_push(&s->stack,lit_var(lits[i]));
                        var_set_tag(s, v, 1);
                    }else{
                        solver2_clear_tags(s, top);
                        return 0;
                    }
                }
            }
        }
    }
    return 1;
}